

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::MessageOptions::SerializeWithCachedSizesToArray
          (MessageOptions *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  UninterpretedOption *this_00;
  uint8 *target_00;
  UnknownFieldSet *pUVar4;
  int local_ec;
  byte *pbStack_e8;
  int i;
  uint8 *target_local;
  MessageOptions *this_local;
  byte *local_40;
  uint8 *local_28;
  byte *local_10;
  
  bVar1 = has_message_set_wire_format(this);
  pbStack_e8 = target;
  if (bVar1) {
    bVar1 = message_set_wire_format(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_28 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_28 = target + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    pbStack_e8 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_28);
  }
  bVar1 = has_no_standard_descriptor_accessor(this);
  if (bVar1) {
    bVar1 = no_standard_descriptor_accessor(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *pbStack_e8 = (byte)uVar3;
      local_40 = pbStack_e8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_e8 = (byte)uVar3 | 0x80;
      pbStack_e8[1] = (byte)(uVar3 >> 7);
      local_40 = pbStack_e8 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_e8);
    }
    pbStack_e8 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_40);
  }
  for (local_ec = 0; iVar2 = uninterpreted_option_size(this), local_ec < iVar2;
      local_ec = local_ec + 1) {
    this_00 = uninterpreted_option(this,local_ec);
    uVar3 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_e8 = (byte)uVar3;
      local_10 = pbStack_e8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_e8 = (byte)uVar3 | 0x80;
      pbStack_e8[1] = (byte)(uVar3 >> 7);
      local_10 = pbStack_e8 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_e8);
    }
    uVar3 = UninterpretedOption::GetCachedSize(this_00);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    pbStack_e8 = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,target_00);
  }
  pbStack_e8 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                         (&this->_extensions_,1000,0x20000000,pbStack_e8);
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    pbStack_e8 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar4,pbStack_e8);
  }
  return pbStack_e8;
}

Assistant:

::google::protobuf::uint8* MessageOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional bool message_set_wire_format = 1 [default = false];
  if (has_message_set_wire_format()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(1, this->message_set_wire_format(), target);
  }

  // optional bool no_standard_descriptor_accessor = 2 [default = false];
  if (has_no_standard_descriptor_accessor()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->no_standard_descriptor_accessor(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}